

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O1

XXH64_hash_t XXH3_hashLong_64b(void *data,size_t len,XXH64_hash_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  ulong uVar8;
  XXH64_hash_t XVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  U32 key [48];
  XXH64_hash_t local_180 [7];
  undefined8 local_148;
  U32 local_140 [74];
  undefined1 auVar13 [16];
  
  local_180[1] = 0x9e3779b185ebca87;
  local_180[2] = 0xc2b2ae3d27d4eb4f;
  local_180[3] = 0x165667b19e3779f9;
  local_180[4] = 0x85ebca77c2b2ae63;
  local_180[5] = 0x27d4eb2f165667c5;
  auVar11 = vpbroadcastd_avx512vl();
  local_180[6] = -seed;
  local_148 = 0;
  auVar5 = vpmovsxbq_avx2(ZEXT416(0xc080400));
  uVar8 = 0;
  auVar17._8_8_ = 1;
  auVar17._0_8_ = 1;
  auVar17._16_8_ = 1;
  auVar17._24_8_ = 1;
  auVar18._8_8_ = 2;
  auVar18._0_8_ = 2;
  auVar18._16_8_ = 2;
  auVar18._24_8_ = 2;
  auVar19._8_8_ = 3;
  auVar19._0_8_ = 3;
  auVar19._16_8_ = 3;
  auVar19._24_8_ = 3;
  auVar20._8_8_ = 0x10;
  auVar20._0_8_ = 0x10;
  auVar20._16_8_ = 0x10;
  auVar20._24_8_ = 0x10;
  do {
    uVar7 = -(uint)(uVar8 < 0xc);
    uVar10 = (ulong)uVar7;
    auVar12 = vpgatherqd_avx512vl(_DAT_0079c0c0);
    bVar3 = (byte)uVar7;
    auVar13._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar12._4_4_;
    auVar13._0_4_ = (uint)(bVar3 & 1) * auVar12._0_4_;
    auVar13._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar12._8_4_;
    auVar13._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar12._12_4_;
    auVar4 = vpaddd_avx(auVar13,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_140;
    vpscatterqd_avx512vl(auVar12 + auVar5._0_16_ * (undefined1  [16])0x4,uVar10,auVar4);
    auVar6 = vpor_avx2(auVar5,auVar17);
    auVar12 = vpgatherqd_avx512vl(*(undefined8 *)(kKey + (long)data));
    auVar14._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar12._4_4_;
    auVar14._0_4_ = (uint)(bVar3 & 1) * auVar12._0_4_;
    auVar14._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar12._8_4_;
    auVar14._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar12._12_4_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_140;
    vpscatterqd_avx512vl(auVar4 + auVar6._0_16_ * (undefined1  [16])0x4,uVar10,auVar14);
    auVar6 = vpor_avx2(auVar5,auVar18);
    auVar12 = vpgatherqd_avx512vl(*(undefined8 *)(kKey + (long)data));
    auVar15._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar12._4_4_;
    auVar15._0_4_ = (uint)(bVar3 & 1) * auVar12._0_4_;
    auVar15._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar12._8_4_;
    auVar15._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar12._12_4_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_140;
    vpscatterqd_avx512vl(auVar1 + auVar6._0_16_ * (undefined1  [16])0x4,uVar10,auVar15);
    auVar6 = vpor_avx2(auVar5,auVar19);
    auVar12 = vpgatherqd_avx512vl(*(undefined8 *)(kKey + (long)data));
    auVar16._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar12._4_4_;
    auVar16._0_4_ = (uint)(bVar3 & 1) * auVar12._0_4_;
    auVar16._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar12._8_4_;
    auVar16._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar12._12_4_;
    auVar12 = vpsubd_avx(auVar16,auVar11);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_140;
    vpscatterqd_avx512vl(auVar2 + auVar6._0_16_ * (undefined1  [16])0x4,uVar10,auVar12);
    uVar8 = uVar8 + 4;
    auVar5 = vpaddq_avx2(auVar5,auVar20);
  } while (uVar8 != 0xc);
  local_180[0] = seed;
  XXH3_hashLong(local_180,data,len);
  XVar9 = XXH3_mergeAccs(local_180,local_140,len * -0x61c8864e7a143579);
  return XVar9;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t    /* It's important for performance that XXH3_hashLong is not inlined. Not sure why (uop cache maybe ?), but difference is large and easily measurable */
XXH3_hashLong_64b(const void* data, size_t len, XXH64_hash_t seed)
{
    ALIGN(64) U64 acc[ACC_NB] = { seed, PRIME64_1, PRIME64_2, PRIME64_3, PRIME64_4, PRIME64_5, (U64)0 - seed, 0 };
    ALIGN(64) U32 key[KEYSET_DEFAULT_SIZE];

    XXH3_initKeySeed(key, seed);

    XXH3_hashLong(acc, data, len);

    /* converge into final hash */
    assert(sizeof(acc) == 64);
    return XXH3_mergeAccs(acc, key, (U64)len * PRIME64_1);
}